

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

uLong cm_zlib_crc32_combine64(uLong crc1,uLong crc2,off_t len2)

{
  z_crc_t zVar1;
  off_t len2_local;
  uLong crc2_local;
  uLong crc1_local;
  
  zVar1 = x2nmodp(len2,3);
  zVar1 = multmodp(zVar1,(z_crc_t)crc1);
  return zVar1 ^ crc2;
}

Assistant:

uLong ZEXPORT crc32_combine64(crc1, crc2, len2)
    uLong crc1;
    uLong crc2;
    z_off64_t len2;
{
#ifdef DYNAMIC_CRC_TABLE
    once(&made, make_crc_table);
#endif /* DYNAMIC_CRC_TABLE */
    return multmodp(x2nmodp(len2, 3), crc1) ^ crc2;
}